

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_3002bd::HelpPrinter::printHelp(HelpPrinter *this)

{
  uint *puVar1;
  void **ppvVar2;
  char *pcVar3;
  long lVar4;
  StringRef *pSVar5;
  StringRef Str;
  atomic<void_*> aVar6;
  void **ppvVar7;
  void *pvVar8;
  raw_ostream *prVar9;
  size_t sVar10;
  size_t sVar11;
  ulong uVar12;
  uint *puVar13;
  code *__n;
  void **ppvVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  uint *puVar18;
  ulong uVar19;
  StringRef *pSVar20;
  StringRef SVar21;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  StringRef Str_03;
  StringRef Str_04;
  StringRef Str_05;
  StringRef Str_06;
  StringRef Str_07;
  StringRef Str_08;
  StringRef Str_09;
  StringRef Str_10;
  StringRef Str_11;
  StringRef Str_12;
  StringRef Str_13;
  StringRef Str_14;
  StringRef Str_15;
  StringRef Str_16;
  StringRef Str_17;
  StringRef Str_18;
  iterator __begin1;
  StrSubCommandPairVector Subs;
  StrOptionPairVector Opts;
  SmallPtrSetIteratorImpl local_1078;
  SmallPtrSetIteratorImpl local_1068;
  HelpPrinter *local_1058;
  SmallVectorTemplateBase<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_true> local_1050;
  undefined1 local_1040 [2048];
  undefined1 *local_840;
  ulong local_838;
  undefined1 local_830 [2048];
  
  if (GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p == (__pointer_type)0x0) {
    llvm::ManagedStaticBase::RegisterManagedStatic
              (&GlobalParser.super_ManagedStaticBase,
               llvm::object_creator<(anonymous_namespace)::CommandLineParser>::call,
               llvm::object_deleter<(anonymous_namespace)::CommandLineParser>::call);
  }
  pSVar20 = *(StringRef **)((long)GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p + 0x128);
  local_840 = local_830;
  local_838 = 0x8000000000;
  local_1058 = this;
  sortOpts((StringMap<llvm::cl::Option_*,_llvm::MallocAllocator> *)pSVar20[8].Data,
           (SmallVectorImpl<std::pair<const_char_*,_llvm::cl::Option_*>_> *)
           (ulong)(uint)pSVar20[8].Length,SUB81(&local_840,0));
  local_1050.super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_void>.
  super_SmallVectorBase.BeginX = local_1040;
  local_1050.super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_void>.
  super_SmallVectorBase.Size = 0;
  local_1050.super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_void>.
  super_SmallVectorBase.Capacity = 0x80;
  if (GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p == (__pointer_type)0x0) {
    llvm::ManagedStaticBase::RegisterManagedStatic
              (&GlobalParser.super_ManagedStaticBase,
               llvm::object_creator<(anonymous_namespace)::CommandLineParser>::call,
               llvm::object_deleter<(anonymous_namespace)::CommandLineParser>::call);
  }
  aVar6._M_b._M_p = GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p;
  local_1068.Bucket = *(void ***)((long)GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p + 0xf0);
  puVar1 = (uint *)((long)GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p + 0xfc);
  puVar18 = (uint *)((long)GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p + 0xf8);
  puVar13 = puVar18;
  if (local_1068.Bucket ==
      *(void ***)((long)GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p + 0xe8)) {
    puVar13 = puVar1;
  }
  local_1068.End = local_1068.Bucket + *puVar13;
  llvm::SmallPtrSetIteratorImpl::AdvanceIfNotValid(&local_1068);
  ppvVar14 = local_1068.Bucket;
  local_1078.Bucket = local_1068.Bucket;
  local_1078.End = local_1068.End;
  lVar16 = *(long *)((long)aVar6._M_b._M_p + 0xf0);
  if (lVar16 == *(long *)((long)aVar6._M_b._M_p + 0xe8)) {
    puVar18 = puVar1;
  }
  __n = (code *)(ulong)*puVar18;
  local_1068.Bucket = (void **)(lVar16 + (long)__n * 8);
  local_1068.End = local_1068.Bucket;
  llvm::SmallPtrSetIteratorImpl::AdvanceIfNotValid(&local_1068);
  ppvVar7 = local_1068.Bucket;
  if (ppvVar14 != local_1068.Bucket) {
    do {
      if (local_1078.End <= ppvVar14) {
        __assert_fail("Bucket < End",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallPtrSet.h"
                      ,0x122,
                      "const PtrTy llvm::SmallPtrSetIterator<llvm::cl::SubCommand *>::operator*() const [PtrTy = llvm::cl::SubCommand *]"
                     );
      }
      ppvVar2 = (void **)*ppvVar14;
      if (ppvVar2[1] != (void *)0x0) {
        __n = (code *)*ppvVar2;
        local_1068.Bucket = (void **)__n;
        local_1068.End = ppvVar2;
        llvm::SmallVectorTemplateBase<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_true>::
        push_back(&local_1050,(pair<const_char_*,_llvm::cl::SubCommand_*> *)&local_1068);
        ppvVar14 = local_1078.Bucket;
      }
      local_1078.Bucket = ppvVar14 + 1;
      llvm::SmallPtrSetIteratorImpl::AdvanceIfNotValid(&local_1078);
      ppvVar14 = local_1078.Bucket;
    } while (local_1078.Bucket != ppvVar7);
  }
  if (1 < (local_1050.
           super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_void>.
           super_SmallVectorBase._8_8_ & 0xffffffff)) {
    __n = SubNameCompare;
    qsort(local_1050.
          super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_void>.
          super_SmallVectorBase.BeginX,
          local_1050.
          super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_void>.
          super_SmallVectorBase._8_8_ & 0xffffffff,0x10,SubNameCompare);
  }
  if (GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p == (__pointer_type)0x0) {
    llvm::ManagedStaticBase::RegisterManagedStatic
              (&GlobalParser.super_ManagedStaticBase,
               llvm::object_creator<(anonymous_namespace)::CommandLineParser>::call,
               llvm::object_deleter<(anonymous_namespace)::CommandLineParser>::call);
  }
  if (*(long *)((long)GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p + 0x28) != 0) {
    prVar9 = llvm::outs();
    SVar21.Length = 10;
    SVar21.Data = "OVERVIEW: ";
    prVar9 = llvm::raw_ostream::operator<<(prVar9,SVar21);
    if (GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p == (__pointer_type)0x0) {
      llvm::ManagedStaticBase::RegisterManagedStatic
                (&GlobalParser.super_ManagedStaticBase,
                 llvm::object_creator<(anonymous_namespace)::CommandLineParser>::call,
                 llvm::object_deleter<(anonymous_namespace)::CommandLineParser>::call);
    }
    prVar9 = llvm::raw_ostream::operator<<
                       (prVar9,*(StringRef *)
                                ((long)GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p + 0x20));
    Str_00.Length = 1;
    Str_00.Data = "\n";
    llvm::raw_ostream::operator<<(prVar9,Str_00);
  }
  if (llvm::cl::TopLevelSubCommand == (StringRef *)0x0) {
    llvm::ManagedStaticBase::RegisterManagedStatic
              ((ManagedStaticBase *)&llvm::cl::TopLevelSubCommand,
               llvm::object_creator<llvm::cl::SubCommand>::call,
               llvm::object_deleter<llvm::cl::SubCommand>::call);
  }
  if (pSVar20 == llvm::cl::TopLevelSubCommand) {
    prVar9 = llvm::outs();
    Str_06.Length = 7;
    Str_06.Data = "USAGE: ";
    prVar9 = llvm::raw_ostream::operator<<(prVar9,Str_06);
    if (GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p == (__pointer_type)0x0) {
      llvm::ManagedStaticBase::RegisterManagedStatic
                (&GlobalParser.super_ManagedStaticBase,
                 llvm::object_creator<(anonymous_namespace)::CommandLineParser>::call,
                 llvm::object_deleter<(anonymous_namespace)::CommandLineParser>::call);
    }
    llvm::raw_ostream::write
              (prVar9,(int)*(undefined8 *)GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p,
               *(void **)((long)GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p + 8),(size_t)__n)
    ;
    if (2 < local_1050.
            super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_void>.
            super_SmallVectorBase.Size) {
      prVar9 = llvm::outs();
      Str_07.Length = 0xd;
      Str_07.Data = " [subcommand]";
      llvm::raw_ostream::operator<<(prVar9,Str_07);
    }
    prVar9 = llvm::outs();
  }
  else {
    if (pSVar20[1].Length != 0) {
      prVar9 = llvm::outs();
      Str_01.Length = 0xc;
      Str_01.Data = "SUBCOMMAND \'";
      prVar9 = llvm::raw_ostream::operator<<(prVar9,Str_01);
      prVar9 = llvm::raw_ostream::operator<<(prVar9,*pSVar20);
      Str_02.Length = 3;
      Str_02.Data = "\': ";
      prVar9 = llvm::raw_ostream::operator<<(prVar9,Str_02);
      prVar9 = llvm::raw_ostream::operator<<(prVar9,pSVar20[1]);
      Str_03.Length = 2;
      Str_03.Data = "\n\n";
      llvm::raw_ostream::operator<<(prVar9,Str_03);
    }
    prVar9 = llvm::outs();
    Str_04.Length = 7;
    Str_04.Data = "USAGE: ";
    prVar9 = llvm::raw_ostream::operator<<(prVar9,Str_04);
    if (GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p == (__pointer_type)0x0) {
      llvm::ManagedStaticBase::RegisterManagedStatic
                (&GlobalParser.super_ManagedStaticBase,
                 llvm::object_creator<(anonymous_namespace)::CommandLineParser>::call,
                 llvm::object_deleter<(anonymous_namespace)::CommandLineParser>::call);
    }
    prVar9 = (raw_ostream *)
             llvm::raw_ostream::write
                       (prVar9,(int)*(undefined8 *)
                                     GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p,
                        *(void **)((long)GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p + 8),
                        (size_t)__n);
    Str_05.Length = 1;
    Str_05.Data = " ";
    prVar9 = llvm::raw_ostream::operator<<(prVar9,Str_05);
    prVar9 = llvm::raw_ostream::operator<<(prVar9,*pSVar20);
  }
  Str_08.Length = 10;
  Str_08.Data = " [options]";
  llvm::raw_ostream::operator<<(prVar9,Str_08);
  uVar15 = (ulong)(uint)pSVar20[2].Length;
  if (uVar15 != 0) {
    pcVar3 = pSVar20[2].Data;
    lVar16 = 0;
    do {
      lVar4 = *(long *)(pcVar3 + lVar16);
      if (*(long *)(lVar4 + 0x20) != 0) {
        prVar9 = llvm::outs();
        Str_09.Length = 3;
        Str_09.Data = " --";
        prVar9 = llvm::raw_ostream::operator<<(prVar9,Str_09);
        llvm::raw_ostream::operator<<(prVar9,*(StringRef *)(lVar4 + 0x18));
      }
      prVar9 = llvm::outs();
      Str_10.Length = 1;
      Str_10.Data = " ";
      prVar9 = llvm::raw_ostream::operator<<(prVar9,Str_10);
      llvm::raw_ostream::operator<<(prVar9,*(StringRef *)(lVar4 + 0x28));
      lVar16 = lVar16 + 8;
    } while (uVar15 << 3 != lVar16);
  }
  if (pSVar20[10].Data != (char *)0x0) {
    prVar9 = llvm::outs();
    Str_11.Length = 1;
    Str_11.Data = " ";
    prVar9 = llvm::raw_ostream::operator<<(prVar9,Str_11);
    __n = (code *)pSVar20[10].Data;
    Str.Data = *(char **)((long)__n + 0x28);
    Str.Length = *(size_t *)((long)__n + 0x30);
    llvm::raw_ostream::operator<<(prVar9,Str);
  }
  if (llvm::cl::TopLevelSubCommand == (StringRef *)0x0) {
    llvm::ManagedStaticBase::RegisterManagedStatic
              ((ManagedStaticBase *)&llvm::cl::TopLevelSubCommand,
               llvm::object_creator<llvm::cl::SubCommand>::call,
               llvm::object_deleter<llvm::cl::SubCommand>::call);
  }
  pvVar8 = local_1050.
           super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_void>.
           super_SmallVectorBase.BeginX;
  if ((pSVar20 == llvm::cl::TopLevelSubCommand) &&
     (uVar15 = local_1050.
               super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_void>
               .super_SmallVectorBase._8_8_ & 0xffffffff, uVar15 != 0)) {
    lVar16 = 0;
    uVar19 = 0;
    do {
      sVar10 = strlen(*(char **)((long)pvVar8 + lVar16));
      if (sVar10 < uVar19) {
        sVar10 = uVar19;
      }
      lVar16 = lVar16 + 0x10;
      uVar19 = sVar10;
    } while (uVar15 << 4 != lVar16);
    prVar9 = llvm::outs();
    Str_12.Length = 2;
    Str_12.Data = "\n\n";
    llvm::raw_ostream::operator<<(prVar9,Str_12);
    prVar9 = llvm::outs();
    Str_13.Length = 0xe;
    Str_13.Data = "SUBCOMMANDS:\n\n";
    llvm::raw_ostream::operator<<(prVar9,Str_13);
    pvVar8 = local_1050.
             super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_void>.
             super_SmallVectorBase.BeginX;
    uVar15 = local_1050.
             super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_void>.
             super_SmallVectorBase._8_8_ & 0xffffffff;
    if (uVar15 != 0) {
      lVar16 = 0;
      do {
        prVar9 = llvm::outs();
        pcVar3 = prVar9->OutBufCur;
        if ((ulong)((long)prVar9->OutBufEnd - (long)pcVar3) < 2) {
          prVar9 = (raw_ostream *)
                   llvm::raw_ostream::write(prVar9,0x1ff5b4,(void *)0x2,(size_t)pcVar3);
        }
        else {
          pcVar3[0] = ' ';
          pcVar3[1] = ' ';
          prVar9->OutBufCur = prVar9->OutBufCur + 2;
        }
        llvm::raw_ostream::operator<<(prVar9,*(char **)((long)pvVar8 + lVar16));
        if (*(long *)(*(long *)((long)pvVar8 + lVar16 + 8) + 0x18) != 0) {
          prVar9 = llvm::outs();
          sVar11 = strlen(*(char **)((long)pvVar8 + lVar16));
          llvm::raw_ostream::indent(prVar9,(int)sVar10 - (int)sVar11);
          prVar9 = llvm::outs();
          pcVar3 = prVar9->OutBufCur;
          if ((ulong)((long)prVar9->OutBufEnd - (long)pcVar3) < 3) {
            prVar9 = (raw_ostream *)
                     llvm::raw_ostream::write(prVar9,0x1fe256,(void *)0x3,(size_t)pcVar3);
          }
          else {
            pcVar3[2] = ' ';
            pcVar3[0] = ' ';
            pcVar3[1] = '-';
            prVar9->OutBufCur = prVar9->OutBufCur + 3;
          }
          llvm::raw_ostream::operator<<
                    (prVar9,*(StringRef *)(*(long *)((long)pvVar8 + lVar16 + 8) + 0x10));
        }
        prVar9 = llvm::outs();
        __n = (code *)prVar9->OutBufCur;
        if ((code *)prVar9->OutBufEnd == __n) {
          llvm::raw_ostream::write(prVar9,0x1f7545,(void *)0x1,(size_t)__n);
        }
        else {
          *__n = (code)0xa;
          prVar9->OutBufCur = prVar9->OutBufCur + 1;
        }
        lVar16 = lVar16 + 0x10;
      } while (uVar15 << 4 != lVar16);
    }
    prVar9 = llvm::outs();
    Str_14.Length = 1;
    Str_14.Data = "\n";
    llvm::raw_ostream::operator<<(prVar9,Str_14);
    prVar9 = llvm::outs();
    Str_15.Length = 8;
    Str_15.Data = "  Type \"";
    prVar9 = llvm::raw_ostream::operator<<(prVar9,Str_15);
    if (GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p == (__pointer_type)0x0) {
      llvm::ManagedStaticBase::RegisterManagedStatic
                (&GlobalParser.super_ManagedStaticBase,
                 llvm::object_creator<(anonymous_namespace)::CommandLineParser>::call,
                 llvm::object_deleter<(anonymous_namespace)::CommandLineParser>::call);
    }
    prVar9 = (raw_ostream *)
             llvm::raw_ostream::write
                       (prVar9,(int)*(undefined8 *)
                                     GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p,
                        *(void **)((long)GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p + 8),
                        (size_t)__n);
    Str_16.Length = 0x3e;
    Str_16.Data = " <subcommand> -help\" to get more help on a specific subcommand";
    llvm::raw_ostream::operator<<(prVar9,Str_16);
  }
  prVar9 = llvm::outs();
  Str_17.Length = 2;
  Str_17.Data = "\n\n";
  llvm::raw_ostream::operator<<(prVar9,Str_17);
  uVar15 = local_838 & 0xffffffff;
  if (uVar15 == 0) {
    uVar19 = 0;
  }
  else {
    lVar16 = 8;
    uVar17 = 0;
    uVar19 = 0;
    do {
      if ((local_838 & 0xffffffff) <= uVar17) {
        __assert_fail("idx < size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                      ,0x9b,
                      "reference llvm::SmallVectorTemplateCommon<std::pair<const char *, llvm::cl::Option *>>::operator[](size_type) [T = std::pair<const char *, llvm::cl::Option *>]"
                     );
      }
      uVar12 = (**(code **)(**(long **)(local_840 + lVar16) + 0x28))();
      if (uVar12 < uVar19) {
        uVar12 = uVar19;
      }
      uVar19 = uVar12;
      uVar17 = uVar17 + 1;
      lVar16 = lVar16 + 0x10;
    } while (uVar15 != uVar17);
  }
  prVar9 = llvm::outs();
  Str_18.Length = 9;
  Str_18.Data = "OPTIONS:\n";
  llvm::raw_ostream::operator<<(prVar9,Str_18);
  (**local_1058->_vptr_HelpPrinter)(local_1058,&local_840,uVar19);
  if (GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p == (__pointer_type)0x0) {
    llvm::ManagedStaticBase::RegisterManagedStatic
              (&GlobalParser.super_ManagedStaticBase,
               llvm::object_creator<(anonymous_namespace)::CommandLineParser>::call,
               llvm::object_deleter<(anonymous_namespace)::CommandLineParser>::call);
  }
  pSVar5 = *(StringRef **)((long)GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p + 0x38);
  for (pSVar20 = *(StringRef **)((long)GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p + 0x30);
      pSVar20 != pSVar5; pSVar20 = pSVar20 + 1) {
    SVar21 = *pSVar20;
    prVar9 = llvm::outs();
    llvm::raw_ostream::operator<<(prVar9,SVar21);
  }
  if (GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p == (__pointer_type)0x0) {
    llvm::ManagedStaticBase::RegisterManagedStatic
              (&GlobalParser.super_ManagedStaticBase,
               llvm::object_creator<(anonymous_namespace)::CommandLineParser>::call,
               llvm::object_deleter<(anonymous_namespace)::CommandLineParser>::call);
  }
  if (*(long *)((long)GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p + 0x38) !=
      *(long *)((long)GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p + 0x30)) {
    *(long *)((long)GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p + 0x38) =
         *(long *)((long)GlobalParser.super_ManagedStaticBase.Ptr._M_b._M_p + 0x30);
  }
  if ((undefined1 *)
      local_1050.
      super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_void>.
      super_SmallVectorBase.BeginX != local_1040) {
    free(local_1050.
         super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::SubCommand_*>,_void>.
         super_SmallVectorBase.BeginX);
  }
  if (local_840 != local_830) {
    free(local_840);
  }
  return;
}

Assistant:

void printHelp() {
    SubCommand *Sub = GlobalParser->getActiveSubCommand();
    auto &OptionsMap = Sub->OptionsMap;
    auto &PositionalOpts = Sub->PositionalOpts;
    auto &ConsumeAfterOpt = Sub->ConsumeAfterOpt;

    StrOptionPairVector Opts;
    sortOpts(OptionsMap, Opts, ShowHidden);

    StrSubCommandPairVector Subs;
    sortSubCommands(GlobalParser->RegisteredSubCommands, Subs);

    if (!GlobalParser->ProgramOverview.empty())
      outs() << "OVERVIEW: " << GlobalParser->ProgramOverview << "\n";

    if (Sub == &*TopLevelSubCommand) {
      outs() << "USAGE: " << GlobalParser->ProgramName;
      if (Subs.size() > 2)
        outs() << " [subcommand]";
      outs() << " [options]";
    } else {
      if (!Sub->getDescription().empty()) {
        outs() << "SUBCOMMAND '" << Sub->getName()
               << "': " << Sub->getDescription() << "\n\n";
      }
      outs() << "USAGE: " << GlobalParser->ProgramName << " " << Sub->getName()
             << " [options]";
    }

    for (auto Opt : PositionalOpts) {
      if (Opt->hasArgStr())
        outs() << " --" << Opt->ArgStr;
      outs() << " " << Opt->HelpStr;
    }

    // Print the consume after option info if it exists...
    if (ConsumeAfterOpt)
      outs() << " " << ConsumeAfterOpt->HelpStr;

    if (Sub == &*TopLevelSubCommand && !Subs.empty()) {
      // Compute the maximum subcommand length...
      size_t MaxSubLen = 0;
      for (size_t i = 0, e = Subs.size(); i != e; ++i)
        MaxSubLen = std::max(MaxSubLen, strlen(Subs[i].first));

      outs() << "\n\n";
      outs() << "SUBCOMMANDS:\n\n";
      printSubCommands(Subs, MaxSubLen);
      outs() << "\n";
      outs() << "  Type \"" << GlobalParser->ProgramName
             << " <subcommand> -help\" to get more help on a specific "
                "subcommand";
    }

    outs() << "\n\n";

    // Compute the maximum argument length...
    size_t MaxArgLen = 0;
    for (size_t i = 0, e = Opts.size(); i != e; ++i)
      MaxArgLen = std::max(MaxArgLen, Opts[i].second->getOptionWidth());

    outs() << "OPTIONS:\n";
    printOptions(Opts, MaxArgLen);

    // Print any extra help the user has declared.
    for (auto I : GlobalParser->MoreHelp)
      outs() << I;
    GlobalParser->MoreHelp.clear();
  }